

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O3

bool ON_SubDEdgeChain::IsClosed(size_t edge_count,ON_SubDEdgePtr *edges)

{
  uint uVar1;
  ON_SubDEdge *edge;
  ulong uVar2;
  long lVar3;
  ulong uVar4;
  bool bVar5;
  
  if (edges != (ON_SubDEdgePtr *)0x0 && 2 < edge_count) {
    uVar2 = edges->m_ptr & 0xfffffffffffffff8;
    if (uVar2 != 0) {
      uVar1 = (uint)edges->m_ptr & 1;
      lVar3 = *(long *)(uVar2 + 0x80 + (ulong)uVar1 * 8);
      if (lVar3 != 0) {
        uVar4 = edges[edge_count - 1].m_ptr & 0xfffffffffffffff8;
        if (((uVar4 != 0) &&
            (lVar3 == *(long *)(uVar4 + 0x80 + (ulong)(~(uint)edges[edge_count - 1].m_ptr & 1) * 8))
            ) && (lVar3 = *(long *)(uVar2 + 0x80 + (ulong)(uVar1 ^ 1) * 8), lVar3 != 0)) {
          uVar2 = 2;
          while( true ) {
            uVar4 = edges[uVar2 - 1].m_ptr & 0xfffffffffffffff8;
            if ((uVar4 == 0) ||
               (uVar1 = (uint)edges[uVar2 - 1].m_ptr & 1,
               lVar3 != *(long *)(uVar4 + 0x80 + (ulong)uVar1 * 8))) break;
            bVar5 = edge_count <= uVar2;
            if (bVar5) {
              return bVar5;
            }
            lVar3 = *(long *)(uVar4 + 0x80 + (ulong)(uVar1 ^ 1) * 8);
            uVar2 = uVar2 + 1;
            if (lVar3 == 0) {
              return bVar5;
            }
          }
        }
      }
    }
  }
  return false;
}

Assistant:

bool ON_SubDEdgeChain::IsClosed(
  size_t edge_count,
  const ON_SubDEdgePtr* edges
)
{
  if (edge_count < 3 || nullptr == edges)
    return false;
  const ON_SubDVertex* v = edges[0].RelativeVertex(0);
  if (nullptr == v)
    return false;
  if (v != edges[edge_count - 1].RelativeVertex(1))
    return false;

  v = edges[0].RelativeVertex(1);
  for (size_t i = 1; i < edge_count; ++i)
  {
    if (nullptr == v)
      return false;
    if (v != edges[i].RelativeVertex(0))
      return false;
    v = edges[i].RelativeVertex(1);
  }

  return true;

}